

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ir.h
# Opt level: O0

void __thiscall wabt::FuncType::~FuncType(FuncType *this)

{
  FuncType *this_local;
  
  ~FuncType(this);
  operator_delete(this,0xf0);
  return;
}

Assistant:

static bool classof(const TypeEntry* entry) {
    return entry->kind() == TypeEntryKind::Func;
  }